

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::ConversionExpression>
          (SampledValueExprVisitor *this,ConversionExpression *expr)

{
  ExpressionKind EVar1;
  Type *this_00;
  bool bVar2;
  KnownSystemName name;
  Symbol *pSVar3;
  Type *pTVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  CallExpression *call;
  DiagCode code;
  ASTContext *this_01;
  SourceRange sourceRange;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 == Call) {
    if (*(char *)&expr[1].super_Expression.constant == '\x01') {
      name = CallExpression::getKnownSystemName((CallExpression *)expr);
      if ((name == Matched) && (expr[1].super_Expression.sourceRange.endLoc != (SourceLocation)0x0))
      {
        this_00 = *(Type **)(*(long *)expr[1].super_Expression.sourceRange.startLoc + 8);
        pTVar4 = this_00->canonical;
        if (pTVar4 == (Type *)0x0) {
          Type::resolveCanonical(this_00);
          pTVar4 = this_00->canonical;
        }
        if ((pTVar4->super_Symbol).kind == SequenceType) {
          ASTContext::addDiag(this->context,this->matchedCode,(expr->super_Expression).sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        bVar2 = SemanticFacts::isGlobalFutureSampledValueFunc(name);
        if (bVar2) {
          this_01 = this->context;
          SVar6 = (expr->super_Expression).sourceRange.startLoc;
          SVar5 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x1d;
          goto LAB_00368380;
        }
      }
    }
  }
  else {
    if (EVar1 != NamedValue) {
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                (expr->operand_,expr->operand_,this);
      return;
    }
    pSVar3 = Expression::getSymbolReference(&expr->super_Expression,true);
    if ((pSVar3 != (Symbol *)0x0) &&
       ((pSVar3->kind == LocalAssertionVar ||
        ((pSVar3->kind == AssertionPort && (*(char *)((long)&pSVar3[2].name._M_len + 4) == '\x01')))
        ))) {
      this_01 = this->context;
      code = this->localVarCode;
      SVar6 = (expr->super_Expression).sourceRange.startLoc;
      SVar5 = (expr->super_Expression).sourceRange.endLoc;
LAB_00368380:
      sourceRange.endLoc = SVar5;
      sourceRange.startLoc = SVar6;
      ASTContext::addDiag(this_01,code,sourceRange);
      return;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        auto ksn = call.getKnownSystemName();
                        if (ksn == KnownSystemName::Matched && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && SemanticFacts::isGlobalFutureSampledValueFunc(ksn))
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }